

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportBuildFileGenerator.cxx
# Opt level: O2

TargetType __thiscall
cmExportBuildFileGenerator::GetExportTargetType
          (cmExportBuildFileGenerator *this,cmGeneratorTarget *target)

{
  bool bVar1;
  TargetType TVar2;
  
  TVar2 = cmGeneratorTarget::GetType(target);
  if (TVar2 == OBJECT_LIBRARY) {
    bVar1 = cmTarget::HasKnownObjectFileLocation(target->Target,(string *)0x0);
    TVar2 = (uint)!bVar1 + (uint)!bVar1 * 2 + OBJECT_LIBRARY;
  }
  return TVar2;
}

Assistant:

cmStateEnums::TargetType cmExportBuildFileGenerator::GetExportTargetType(
  cmGeneratorTarget const* target) const
{
  cmStateEnums::TargetType targetType = target->GetType();
  // An object library exports as an interface library if we cannot
  // tell clients where to find the objects.  This is sufficient
  // to support transitive usage requirements on other targets that
  // use the object library.
  if (targetType == cmStateEnums::OBJECT_LIBRARY &&
      !target->Target->HasKnownObjectFileLocation(nullptr)) {
    targetType = cmStateEnums::INTERFACE_LIBRARY;
  }
  return targetType;
}